

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseBuilder::newAlignNode
          (BaseBuilder *this,AlignNode **out,AlignMode alignMode,uint32_t alignment)

{
  Error EVar1;
  AlignNode *pAVar2;
  AlignNode **unaff_RBX;
  BaseBuilder *unaff_R15;
  size_t sStack_28;
  
  *out = (AlignNode *)0x0;
  if (*(long *)&this->_allocator == 0) {
    newAlignNode();
  }
  else {
    pAVar2 = (AlignNode *)ZoneAllocator::_alloc(&this->_allocator,0x38,&sStack_28);
    unaff_RBX = out;
    unaff_R15 = this;
    if (pAVar2 != (AlignNode *)0x0) {
      *(undefined8 *)pAVar2 = 0;
      *(undefined8 *)(pAVar2 + 8) = 0;
      pAVar2[0x10] = (AlignNode)0x4;
      pAVar2[0x11] = (AlignNode)(this->_nodeFlags | (kHasNoEffect|kIsCode));
      *(undefined8 *)(pAVar2 + 0x12) = 0;
      *(undefined8 *)(pAVar2 + 0x1a) = 0;
      *(undefined8 *)(pAVar2 + 0x20) = 0;
      *(undefined8 *)(pAVar2 + 0x28) = 0;
      pAVar2[0x12] = (AlignNode)alignMode;
      *(uint32_t *)(pAVar2 + 0x30) = alignment;
      *out = pAVar2;
      return 0;
    }
  }
  *unaff_RBX = (AlignNode *)0x0;
  EVar1 = BaseEmitter::reportError(&unaff_R15->super_BaseEmitter,1,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseBuilder::newAlignNode(AlignNode** out, AlignMode alignMode, uint32_t alignment) {
  *out = nullptr;
  return _newNodeT<AlignNode>(out, alignMode, alignment);
}